

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_algo_struct.c
# Opt level: O3

void pl_computePhnHeur(mdef_t *md,ascr_t *a,pl_t *pl,int32 heutype,int32 win_strt,int32 win_efv)

{
  short sVar1;
  short sVar2;
  int32 *piVar3;
  short *psVar4;
  s3cipid_t *psVar5;
  int32 *piVar6;
  short *psVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  int32 iVar13;
  short sVar14;
  int iVar15;
  int iVar16;
  s3cipid_t sVar17;
  uint uVar18;
  int iVar19;
  
  iVar15 = md->n_emit_state;
  piVar3 = pl->phn_heur_list;
  psVar4 = md->cd2cisen;
  sVar1 = *psVar4;
  if (sVar1 == 0) {
    psVar5 = md->sen2cimap;
    uVar12 = 0;
    do {
      piVar3[psVar5[uVar12]] = 0;
      lVar11 = uVar12 + 1;
      uVar12 = uVar12 + 1;
    } while (uVar12 == (uint)(int)psVar4[lVar11]);
  }
  if (heutype == 1) {
    if (win_strt < win_efv) {
      lVar11 = (long)win_strt;
      do {
        if (sVar1 == 0) {
          piVar6 = a->cache_ci_senscr[lVar11];
          psVar7 = md->sen2cimap;
          uVar18 = 0x80000000;
          uVar12 = 0;
          sVar14 = *psVar7;
          do {
            uVar10 = piVar6[uVar12];
            if (piVar6[uVar12] < (int)uVar18) {
              uVar10 = uVar18;
            }
            sVar2 = psVar7[uVar12 + 1];
            uVar18 = uVar10;
            if (sVar14 != sVar2) {
              iVar15 = piVar3[sVar14] + uVar10;
              uVar18 = 0x80000000;
              iVar13 = iVar15;
              if ((int)(piVar3[sVar14] & uVar10) < 0) {
                iVar13 = -0x80000000;
              }
              if (iVar15 < 1) {
                iVar13 = iVar15;
              }
              piVar3[sVar14] = iVar13;
            }
            lVar8 = uVar12 + 1;
            uVar12 = uVar12 + 1;
            sVar14 = sVar2;
          } while (uVar12 == (uint)(int)psVar4[lVar8]);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != win_efv);
    }
  }
  else if (heutype == 2) {
    if (win_strt < win_efv) {
      lVar11 = (long)win_strt;
      do {
        if (sVar1 == 0) {
          piVar6 = a->cache_ci_senscr[lVar11];
          psVar5 = md->sen2cimap;
          uVar18 = 0x80000000;
          uVar12 = 0;
          sVar17 = *psVar5;
          do {
            uVar10 = piVar6[uVar12] + uVar18;
            uVar9 = uVar10;
            if ((int)(piVar6[uVar12] & uVar18) < 0) {
              uVar9 = 0x80000000;
            }
            uVar18 = uVar9;
            if ((int)uVar10 < 1) {
              uVar18 = uVar10;
            }
            sVar14 = psVar5[uVar12 + 1];
            if (sVar17 != sVar14) {
              uVar10 = (int)uVar18 / iVar15;
              iVar19 = piVar3[sVar17] + uVar10;
              uVar18 = 0x80000000;
              iVar16 = -0x80000000;
              if (-1 < (int)(piVar3[sVar17] & uVar10)) {
                iVar16 = iVar19;
              }
              if (iVar19 < 1) {
                iVar16 = iVar19;
              }
              piVar3[sVar17] = iVar16;
            }
            lVar8 = uVar12 + 1;
            uVar12 = uVar12 + 1;
            sVar17 = sVar14;
          } while (uVar12 == (uint)(int)psVar4[lVar8]);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != win_efv);
    }
  }
  else if ((heutype == 3) && (win_strt < win_efv)) {
    lVar11 = (long)win_strt;
    do {
      if (sVar1 == 0) {
        psVar5 = md->sen2cimap;
        piVar6 = a->cache_ci_senscr[lVar11];
        uVar12 = 0;
        uVar18 = 0x80000000;
        iVar15 = 0;
        do {
          if ((iVar15 == 0) || (iVar15 != psVar5[uVar12 - 1])) {
            uVar10 = piVar6[uVar12];
            iVar19 = uVar10 + piVar3[iVar15];
            iVar16 = iVar19;
            if ((int)(uVar10 & piVar3[iVar15]) < 0) {
              iVar16 = -0x80000000;
            }
            if (iVar19 < 1) {
              iVar16 = iVar19;
            }
            piVar3[iVar15] = iVar16;
          }
          iVar15 = (int)psVar5[uVar12];
          uVar10 = piVar6[uVar12];
          if ((int)uVar10 < (int)uVar18) {
            uVar10 = uVar18;
          }
          uVar18 = uVar10;
          if (psVar5[uVar12] != psVar5[uVar12 + 1]) {
            iVar19 = piVar3[iVar15] + uVar10;
            uVar18 = 0x80000000;
            iVar13 = iVar19;
            if ((int)(piVar3[iVar15] & uVar10) < 0) {
              iVar13 = -0x80000000;
            }
            if (iVar19 < 1) {
              iVar13 = iVar19;
            }
            piVar3[iVar15] = iVar13;
          }
          lVar8 = uVar12 + 1;
          uVar12 = uVar12 + 1;
        } while (uVar12 == (uint)(int)psVar4[lVar8]);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != win_efv);
  }
  return;
}

Assistant:

void
pl_computePhnHeur(mdef_t * md, ascr_t * a, pl_t * pl, int32 heutype,
                  int32 win_strt, int32 win_efv)
{
    int32 nState;
    int32 i, j;
    int32 curPhn, curFrmPhnVar; /* variables for phoneme lookahead computation */
    int32 *ph_lst;

    nState = mdef_n_emit_state(md);
    ph_lst = pl->phn_heur_list;

    /* Initializing all the phoneme heuristics for each phone to be 0 */
    for (j = 0; j == md->cd2cisen[j]; j++) {
        curPhn = md->sen2cimap[j];      /*Just to save a warning */
        ph_lst[curPhn] = 0;
    }

    /* 20040503: ARCHAN, the code can be reduced to 10 lines, it is so
       organized such that there is no overhead in checking the
       heuristic type in the inner loop.  
     */
    /* One trick we use is to use sen2cimap to check phoneme ending boundary */


    if (heutype == 1) {         /* Taking Max */
        for (i = win_strt; i < win_efv; i++) {
            curPhn = 0;
            curFrmPhnVar = MAX_NEG_INT32;
            for (j = 0; j == md->cd2cisen[j]; j++) {
                if (curFrmPhnVar < a->cache_ci_senscr[i][j])
                    curFrmPhnVar = a->cache_ci_senscr[i][j];

                curPhn = md->sen2cimap[j];
                /* Update at the phone_end boundary */
                if (curPhn != md->sen2cimap[j + 1]) {
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn], curFrmPhnVar);
                    curFrmPhnVar = MAX_NEG_INT32;
                }
            }
        }
    }
    else if (heutype == 2) {
        for (i = win_strt; i < win_efv; i++) {
            curPhn = 0;
            curFrmPhnVar = MAX_NEG_INT32;
            for (j = 0; j == md->cd2cisen[j]; j++) {
                curFrmPhnVar =
                    NO_UFLOW_ADD(a->cache_ci_senscr[i][j], curFrmPhnVar);
                curPhn = md->sen2cimap[j];

                /* Update at the phone_end boundary */
                if (curPhn != md->sen2cimap[j + 1]) {
                    curFrmPhnVar /= nState;     /* ARCHAN: I hate to do division ! */
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn], curFrmPhnVar);
                    curFrmPhnVar = MAX_NEG_INT32;
                }
            }
        }
    }
    else if (heutype == 3) {
        for (i = win_strt; i < win_efv; i++) {
            curPhn = 0;
            curFrmPhnVar = MAX_NEG_INT32;
            for (j = 0; j == md->cd2cisen[j]; j++) {
                if (curPhn == 0 || curPhn != md->sen2cimap[j - 1])      /* dangerous hack! */
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn],
                                     a->cache_ci_senscr[i][j]);

                curPhn = md->sen2cimap[j];

                if (curFrmPhnVar < a->cache_ci_senscr[i][j])
                    curFrmPhnVar = a->cache_ci_senscr[i][j];

                /* Update at the phone_end boundary */
                if (md->sen2cimap[j] != md->sen2cimap[j + 1]) {
                    ph_lst[curPhn] =
                        NO_UFLOW_ADD(ph_lst[curPhn], curFrmPhnVar);
                    curFrmPhnVar = MAX_NEG_INT32;
                }
            }
        }
    }

#if 0
    for (j = 0; j == md->cd2cisen[j]; j++) {
        curPhn = md->cd2cisen[j];
        E_INFO("phoneme heuristics scores at phn %d is %d\n", j,
               kb->phn_list[mdef->sen2cimap[j]]);
    }
#endif


}